

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void V_UpdateModeSize(int width,int height)

{
  int iVar1;
  int iVar2;
  int local_18;
  int local_14;
  int cx2;
  int cx1;
  int height_local;
  int width_local;
  
  cx2 = height;
  cx1 = width;
  V_CalcCleanFacs(0x140,200,width,height,&CleanXfac,&CleanYfac,&local_14,&local_18);
  CleanWidth = cx1 / CleanXfac;
  CleanHeight = cx2 / CleanYfac;
  if (CleanWidth < 0x140) {
    __assert_fail("CleanWidth >= 320",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52b,"void V_UpdateModeSize(int, int)");
  }
  if (199 < CleanHeight) {
    if ((cx1 < 800) || (0x3bf < cx1)) {
      if (local_14 < local_18) {
        CleanYfac_1 = local_14;
        CleanXfac_1 = local_14;
      }
      else {
        CleanXfac_1 = MAX<int>(CleanXfac + -1,1);
        CleanYfac_1 = MAX<int>(CleanYfac + -1,1);
        for (; iVar1 = CleanXfac_1 * 0x140, iVar2 = DCanvas::GetWidth((DCanvas *)screen),
            (iVar2 * 3) / 4 < iVar1 && 2 < CleanXfac_1; CleanXfac_1 = CleanXfac_1 + -1) {
          CleanYfac_1 = CleanYfac_1 + -1;
        }
      }
      CleanWidth_1 = cx1 / CleanXfac_1;
      CleanHeight_1 = cx2 / CleanYfac_1;
    }
    else {
      CleanXfac_1 = CleanXfac;
      CleanYfac_1 = CleanYfac;
      CleanWidth_1 = CleanWidth;
      CleanHeight_1 = CleanHeight;
    }
    DisplayWidth = cx1;
    DisplayHeight = cx2;
    R_OldBlend = 0xffffffff;
    (*Renderer->_vptr_FRenderer[0xc])();
    return;
  }
  __assert_fail("CleanHeight >= 200",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                ,0x52c,"void V_UpdateModeSize(int, int)");
}

Assistant:

void V_UpdateModeSize (int width, int height)
{
	int cx1, cx2;
	V_CalcCleanFacs(320, 200, width, height, &CleanXfac, &CleanYfac, &cx1, &cx2);

	CleanWidth = width / CleanXfac;
	CleanHeight = height / CleanYfac;
	assert(CleanWidth >= 320);
	assert(CleanHeight >= 200);

	if (width < 800 || width >= 960)
	{
		if (cx1 < cx2)
		{
			// Special case in which we don't need to scale down.
			CleanXfac_1 = 
			CleanYfac_1 = cx1;
		}
		else
		{
			CleanXfac_1 = MAX(CleanXfac - 1, 1);
			CleanYfac_1 = MAX(CleanYfac - 1, 1);
			// On larger screens this is not enough so make sure it's at most 3/4 of the screen's width
			while (CleanXfac_1 * 320 > screen->GetWidth()*3/4 && CleanXfac_1 > 2)
			{
				CleanXfac_1--;
				CleanYfac_1--;
			}
		}
		CleanWidth_1 = width / CleanXfac_1;
		CleanHeight_1 = height / CleanYfac_1;
	}
	else // if the width is between 800 and 960 the ratio between the screensize and CleanXFac-1 becomes too large.
	{
		CleanXfac_1 = CleanXfac;
		CleanYfac_1 = CleanYfac;
		CleanWidth_1 = CleanWidth;
		CleanHeight_1 = CleanHeight;
	}


	DisplayWidth = width;
	DisplayHeight = height;

	R_OldBlend = ~0;
	Renderer->OnModeSet();
}